

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalize.cc
# Opt level: O2

bool woff2::NormalizeOffsets(Font *font)

{
  uint uVar1;
  mapped_type *pmVar2;
  uint uVar3;
  uint32_t uVar4;
  pointer puVar5;
  uint tag;
  uint local_44;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_40;
  
  uVar4 = (uint)font->num_tables << 4 | 0xc;
  Font::OutputOrderedTags((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_40,font);
  for (puVar5 = local_40._M_impl.super__Vector_impl_data._M_start;
      puVar5 != local_40._M_impl.super__Vector_impl_data._M_finish; puVar5 = puVar5 + 1) {
    local_44 = *puVar5;
    pmVar2 = std::
             map<unsigned_int,_woff2::Font::Table,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_woff2::Font::Table>_>_>
             ::operator[](&font->tables,&local_44);
    pmVar2->offset = uVar4;
    uVar1 = pmVar2->length;
    uVar3 = uVar1 + 3 & 0xfffffffc;
    if (0xfffffffc < uVar1) {
      uVar3 = uVar1;
    }
    uVar4 = uVar4 + uVar3;
  }
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_40);
  return true;
}

Assistant:

bool NormalizeOffsets(Font* font) {
  uint32_t offset = 12 + 16 * font->num_tables;
  for (auto tag : font->OutputOrderedTags()) {
    auto& table = font->tables[tag];
    table.offset = offset;
    offset += Round4(table.length);
  }
  return true;
}